

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_stalker.cpp
# Opt level: O0

int AF_A_StalkerLookInit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  uint uVar1;
  bool bVar2;
  bool local_62;
  bool local_5f;
  FName local_5c;
  FName local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  FState *local_50;
  FState *state;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                  ,0x1f,"int AF_A_StalkerLookInit(VMFrameStack *, VMValue *, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_5f = true;
    if (stateowner != (AActor *)0x0) {
      local_5f = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_5f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                    ,0x1f,
                    "int AF_A_StalkerLookInit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                      ,0x1f,
                      "int AF_A_StalkerLookInit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_62 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_62 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_62 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                      ,0x1f,
                      "int AF_A_StalkerLookInit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                      ,0x1f,
                      "int AF_A_StalkerLookInit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      state = (FState *)pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      state = (FState *)0x0;
    }
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_54,
               (int)stateowner + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
    this = stateowner;
    if (uVar1 == 0) {
      FName::FName(&local_5c,"LookFloor");
      local_50 = AActor::FindState(this,&local_5c);
    }
    else {
      FName::FName(&local_58,"LookCeiling");
      local_50 = AActor::FindState(this,&local_58);
    }
    if (stateowner->state->NextState != local_50) {
      AActor::SetState(stateowner,local_50,false);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                ,0x1f,"int AF_A_StalkerLookInit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_StalkerLookInit)
{
	PARAM_ACTION_PROLOGUE;

	FState *state;
	if (self->flags & MF_NOGRAVITY)
	{
		state = self->FindState("LookCeiling");
	}
	else
	{
		state = self->FindState("LookFloor");
	}
	if (self->state->NextState != state)
	{
		self->SetState (state);
	}
	return 0;
}